

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

UBool uprv_isInvariantString_63(char *s,int32_t length)

{
  byte *pbVar1;
  byte local_1d;
  int local_1c;
  uint8_t c;
  byte *pbStack_18;
  int32_t length_local;
  char *s_local;
  
  local_1c = length;
  pbVar1 = (byte *)s;
LAB_0036c73b:
  do {
    pbStack_18 = pbVar1;
    if (local_1c < 0) {
      local_1d = *pbStack_18;
      if (local_1d == 0) {
        return '\x01';
      }
    }
    else {
      if (local_1c == 0) {
        return '\x01';
      }
      local_1c = local_1c + -1;
      local_1d = *pbStack_18;
      pbVar1 = pbStack_18 + 1;
      if (local_1d == 0) goto LAB_0036c73b;
    }
    pbStack_18 = pbStack_18 + 1;
    if ((0x7f < local_1d) ||
       (pbVar1 = pbStack_18,
       (invariantChars[(int)(uint)local_1d >> 5] & 1 << (local_1d & 0x1f)) == 0)) {
      return '\0';
    }
  } while( true );
}

Assistant:

U_CAPI UBool U_EXPORT2
uprv_isInvariantString(const char *s, int32_t length) {
    uint8_t c;

    for(;;) {
        if(length<0) {
            /* NUL-terminated */
            c=(uint8_t)*s++;
            if(c==0) {
                break;
            }
        } else {
            /* count length */
            if(length==0) {
                break;
            }
            --length;
            c=(uint8_t)*s++;
            if(c==0) {
                continue; /* NUL is invariant */
            }
        }
        /* c!=0 now, one branch below checks c==0 for variant characters */

        /*
         * no assertions here because these functions are legitimately called
         * for strings with variant characters
         */
#if U_CHARSET_FAMILY==U_ASCII_FAMILY
        if(!UCHAR_IS_INVARIANT(c)) {
            return FALSE; /* found a variant char */
        }
#elif U_CHARSET_FAMILY==U_EBCDIC_FAMILY
        c=CHAR_TO_UCHAR(c);
        if(c==0 || !UCHAR_IS_INVARIANT(c)) {
            return FALSE; /* found a variant char */
        }
#else
#   error U_CHARSET_FAMILY is not valid
#endif
    }
    return TRUE;
}